

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__pnm_info(stbi__context *s,int *x,int *y,int *comp)

{
  int iVar1;
  stbi_uc *psVar2;
  stbi_uc sVar3;
  stbi_uc *psVar4;
  stbi_uc *psVar5;
  stbi_uc sVar6;
  stbi_uc local_31 [8];
  char c;
  
  psVar2 = s->img_buffer_end;
  psVar4 = s->img_buffer_original;
  s->img_buffer = psVar4;
  if (psVar4 < psVar2) {
    s->img_buffer = psVar4 + 1;
    sVar6 = *psVar4;
    psVar4 = psVar4 + 1;
  }
  else if (s->read_from_callbacks == 0) {
    sVar6 = '\0';
  }
  else {
    psVar4 = s->buffer_start;
    iVar1 = (*(s->io).read)(s->io_user_data,(char *)psVar4,s->buflen);
    if (iVar1 == 0) {
      s->read_from_callbacks = 0;
      psVar2 = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
      sVar6 = '\0';
    }
    else {
      psVar2 = psVar4 + iVar1;
      sVar6 = *psVar4;
    }
    s->img_buffer_end = psVar2;
    psVar4 = s->buffer_start + 1;
    s->img_buffer = psVar4;
  }
  if (psVar4 < psVar2) {
    psVar5 = psVar4 + 1;
    s->img_buffer = psVar5;
    sVar3 = *psVar4;
  }
  else {
    if (s->read_from_callbacks == 0) goto LAB_0011fd9e;
    psVar4 = s->buffer_start;
    iVar1 = (*(s->io).read)(s->io_user_data,(char *)psVar4,s->buflen);
    if (iVar1 == 0) {
      s->read_from_callbacks = 0;
      psVar2 = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
      sVar3 = '\0';
    }
    else {
      psVar2 = psVar4 + iVar1;
      sVar3 = *psVar4;
    }
    s->img_buffer_end = psVar2;
    psVar5 = s->buffer_start + 1;
    s->img_buffer = psVar5;
  }
  if ((sVar6 == 'P') && (0xfd < (byte)(sVar3 - 0x37))) {
    *comp = (uint)(sVar3 == '6') * 2 + 1;
    if (psVar5 < psVar2) {
      s->img_buffer = psVar5 + 1;
      local_31[0] = *psVar5;
    }
    else if (s->read_from_callbacks == 0) {
      local_31[0] = '\0';
    }
    else {
      psVar4 = s->buffer_start;
      iVar1 = (*(s->io).read)(s->io_user_data,(char *)psVar4,s->buflen);
      if (iVar1 == 0) {
        s->read_from_callbacks = 0;
        psVar2 = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
        local_31[0] = '\0';
      }
      else {
        psVar2 = psVar4 + iVar1;
        local_31[0] = *psVar4;
      }
      s->img_buffer_end = psVar2;
      s->img_buffer = s->buffer_start + 1;
    }
    stbi__pnm_skip_whitespace(s,(char *)local_31);
    iVar1 = stbi__pnm_getinteger(s,(char *)local_31);
    *x = iVar1;
    stbi__pnm_skip_whitespace(s,(char *)local_31);
    iVar1 = stbi__pnm_getinteger(s,(char *)local_31);
    *y = iVar1;
    stbi__pnm_skip_whitespace(s,(char *)local_31);
    iVar1 = stbi__pnm_getinteger(s,(char *)local_31);
    if (0xff < iVar1) {
      stbi__g_failure_reason = "max value > 255";
      return 0;
    }
    return 1;
  }
LAB_0011fd9e:
  s->img_buffer = s->img_buffer_original;
  return 0;
}

Assistant:

static int      stbi__pnm_info(stbi__context *s, int *x, int *y, int *comp)
{
   int maxv;
   char c, p, t;

   stbi__rewind( s );

   // Get identifier
   p = (char) stbi__get8(s);
   t = (char) stbi__get8(s);
   if (p != 'P' || (t != '5' && t != '6')) {
       stbi__rewind( s );
       return 0;
   }

   *comp = (t == '6') ? 3 : 1;  // '5' is 1-component .pgm; '6' is 3-component .ppm

   c = (char) stbi__get8(s);
   stbi__pnm_skip_whitespace(s, &c);

   *x = stbi__pnm_getinteger(s, &c); // read width
   stbi__pnm_skip_whitespace(s, &c);

   *y = stbi__pnm_getinteger(s, &c); // read height
   stbi__pnm_skip_whitespace(s, &c);

   maxv = stbi__pnm_getinteger(s, &c);  // read max value

   if (maxv > 255)
      return stbi__err("max value > 255", "PPM image not 8-bit");
   else
      return 1;
}